

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::RecreateBufferDataStoreCase::iterate(RecreateBufferDataStoreCase *this)

{
  CallLogWrapper *this_00;
  deUint32 dVar1;
  deUint32 buffer;
  uint uVar2;
  int iVar3;
  size_t in_R9;
  pointer pDVar4;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  BufferVerifier local_50;
  ReferenceBuffer local_48;
  
  dVar1 = deStringHash((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_dataplus._M_p);
  BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_50,(this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  pDVar4 = (this->m_specs).
           super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pDVar4 != (this->m_specs).
                super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &(this->super_BufferCase).super_CallLogWrapper;
    do {
      BufferTestUtil::ReferenceBuffer::setSize(&local_48,pDVar4->size);
      uVar2 = pDVar4->target + pDVar4->size + pDVar4->usage;
      uVar2 = (uVar2 >> 0x10 ^ uVar2 ^ 0x3d) * 9;
      uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
      BufferTestUtil::fillWithRandomBytes
                (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,pDVar4->size,
                 uVar2 >> 0xf ^ dVar1 ^ uVar2 ^ 0xbeef);
      glu::CallLogWrapper::glBindBuffer(this_00,pDVar4->target,buffer);
      glu::CallLogWrapper::glBufferData
                (this_00,pDVar4->target,(long)pDVar4->size,
                 local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,pDVar4->usage);
      BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
      iVar3 = BufferTestUtil::BufferVerifier::verify
                        (&local_50,(EVP_PKEY_CTX *)(ulong)buffer,
                         local_48.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,0,(uchar *)(ulong)(uint)pDVar4->size,in_R9
                        );
      if ((char)iVar3 == '\0') {
        tcu::TestContext::setTestResult
                  ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        break;
      }
      pDVar4 = pDVar4 + 1;
    } while (pDVar4 != (this->m_specs).
                       super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
  if (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (deUint8 *)0x0) {
    operator_delete(local_48.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BufferTestUtil::BufferVerifier::~BufferVerifier(&local_50);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			baseSeed	= deStringHash(getName()) ^ 0xbeef;
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		const deUint32			buf			= genBuffer();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		for (vector<DataStoreSpec>::const_iterator spec = m_specs.begin(); spec != m_specs.end(); spec++)
		{
			bool iterOk = false;

			refBuf.setSize(spec->size);
			fillWithRandomBytes(refBuf.getPtr(), spec->size, baseSeed ^ deInt32Hash(spec->size+spec->target+spec->usage));

			glBindBuffer(spec->target, buf);
			glBufferData(spec->target, spec->size, refBuf.getPtr(), spec->usage);

			checkError();

			iterOk = verifier.verify(buf, refBuf.getPtr(), 0, spec->size);

			if (!iterOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				break;
			}
		}

		deleteBuffer(buf);
		return STOP;
	}